

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.cc
# Opt level: O3

int main(int argc,char **argv)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  char *pcVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  undefined7 uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ostream *this;
  size_t sVar9;
  byte bVar11;
  long lVar12;
  long lVar13;
  string *psVar14;
  int fft_length;
  int num_denominator_order;
  int num_numerator_order;
  double relative_floor_in_decibels;
  double epsilon;
  vector<double,_std::allocator<double>_> waveform;
  vector<double,_std::allocator<double>_> numerator_coefficients;
  ostringstream error_message;
  vector<double,_std::allocator<double>_> denominator_coefficients;
  ifstream ifs_for_denominator;
  vector<double,_std::allocator<double>_> output;
  int tmp;
  Buffer buffer;
  FilterCoefficientsToSpectrum filter_coefficients_to_spectrum;
  int local_7f4;
  int local_7f0;
  int local_7ec;
  string *local_7e8;
  ulong local_7e0;
  ulong local_7d8;
  double local_7d0;
  double local_7c8;
  string local_7c0;
  ulong local_7a0;
  char *local_798;
  string *local_790;
  vector<double,_std::allocator<double>_> local_788;
  string local_770;
  byte abStack_750 [80];
  ios_base local_700 [408];
  vector<double,_std::allocator<double>_> local_568;
  string local_550;
  byte abStack_530 [80];
  ios_base local_4e0 [408];
  vector<double,_std::allocator<double>_> local_348;
  undefined1 local_330 [208];
  bool local_260;
  Buffer local_1b8;
  undefined1 local_100 [8];
  undefined1 local_f8 [120];
  SpectrumToSpectrum local_80;
  bool local_38;
  
  local_7f4 = 0x100;
  local_7ec = 0;
  local_7a0 = 0;
  local_7f0 = 0;
  local_7c8 = 0.0;
  local_7d0 = -1.79769313486232e+308;
  psVar14 = &local_770;
  local_7e0 = 0;
  local_7d8 = 0;
  local_798 = (char *)0x0;
  local_7e8 = (string *)0x0;
LAB_0010383e:
  while (iVar7 = ya_getopt_long(argc,argv,"l:m:n:z:p:e:E:o:h",(option *)0x0,(int *)0x0),
        iVar7 < 0x65) {
    if (iVar7 != 0x45) {
      if (iVar7 != -1) goto switchD_00103868_caseD_66;
      bVar5 = sptk::SetBinaryMode();
      uVar3 = local_7d8;
      if (!bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_770);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_770,"Cannot set translation mode",0x1b);
        local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"spec","");
        sptk::PrintErrorMessage(&local_550,(ostringstream *)&local_770);
        goto LAB_00103f5f;
      }
      bVar11 = (byte)local_7d8;
      if (((local_7d8 & 1) == 0) && ((local_7e0 & 1) == 0)) {
        if (1 < argc - ya_optind) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_770);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_770,"Too many input files",0x14);
          local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"spec","");
          sptk::PrintErrorMessage(&local_550,(ostringstream *)&local_770);
          goto LAB_00103f5f;
        }
        if (argc == ya_optind) {
          std::ifstream::ifstream(&local_770);
        }
        else {
          pcVar2 = argv[ya_optind];
          std::ifstream::ifstream(&local_770);
          if ((pcVar2 != (char *)0x0) &&
             (std::ifstream::open((char *)&local_770,(_Ios_Openmode)pcVar2),
             (abStack_750[*(long *)(local_770._M_dataplus._M_p + -0x18)] & 5) != 0)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_550);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_550,"Cannot open file ",0x11);
            sVar9 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_550,pcVar2,sVar9);
            local_330._0_8_ = local_330 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"spec","");
            sptk::PrintErrorMessage((string *)local_330,(ostringstream *)&local_550);
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_550);
            std::ios_base::~ios_base(local_4e0);
            std::ifstream::~ifstream(&local_770);
            return 1;
          }
        }
        cVar6 = std::__basic_file<char>::is_open();
        if (cVar6 == '\0') {
          psVar14 = (string *)&std::cin;
        }
        sptk::WaveformToSpectrum::WaveformToSpectrum
                  ((WaveformToSpectrum *)local_330,local_7f4,local_7f4,(InputOutputFormats)local_7a0
                   ,local_7c8,local_7d0);
        local_100 = (undefined1  [8])&PTR__Buffer_00114898;
        local_f8._0_8_ = &PTR__Buffer_001147a8;
        local_f8._8_8_ = &PTR__Buffer_001147d8;
        memset(local_f8 + 0x10,0,0xa8);
        iVar7 = local_7f4;
        if (local_260 != false) {
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)&local_7c0,(long)local_7f4,
                     (allocator_type *)&local_550);
          iVar7 = iVar7 / 2 + 1;
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_788,(long)iVar7,(allocator_type *)&local_550);
          goto LAB_00104791;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_550);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_550,"Failed to set condition for transformation",0x2a);
        pvVar1 = &local_1b8.fast_fourier_transform_buffer_.real_part_input_;
        local_1b8._vptr_Buffer = (_func_int **)pvVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"spec","");
        sptk::PrintErrorMessage((string *)&local_1b8,(ostringstream *)&local_550);
        if ((vector<double,_std::allocator<double>_> *)local_1b8._vptr_Buffer != pvVar1) {
          operator_delete(local_1b8._vptr_Buffer);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_550);
        std::ios_base::~ios_base(local_4e0);
        iVar7 = 1;
        bVar5 = false;
        goto LAB_00104ae8;
      }
      lVar12 = (long)local_7ec;
      lVar13 = (long)local_7f0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_788,lVar12 + 1U,(allocator_type *)&local_770);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_568,lVar13 + 1U,(allocator_type *)&local_770);
      if ((((uVar3 & 1) == 0) || ((local_7e0 & 1) == 0)) ||
         (local_798 != (char *)0x0 && local_7e8 != (string *)0x0)) {
        if (argc <= ya_optind) {
          local_790 = &local_770;
          std::ifstream::ifstream(local_790);
          pcVar2 = local_798;
          psVar14 = local_7e8;
          if ((local_7e8 != (string *)0x0 & bVar11) == 1) {
            std::ifstream::open((char *)&local_770,(_Ios_Openmode)local_7e8);
            if ((abStack_750[*(long *)(local_770._M_dataplus._M_p + -0x18)] & 5) != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_550);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_550,"Cannot open file ",0x11);
              sVar9 = strlen((char *)psVar14);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_550,(char *)psVar14,sVar9);
              local_330._0_8_ = local_330 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"spec","");
              sptk::PrintErrorMessage((string *)local_330,(ostringstream *)&local_550);
              if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
                operator_delete((void *)local_330._0_8_);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_550);
              std::ios_base::~ios_base(local_4e0);
              iVar7 = 1;
              bVar5 = false;
              goto LAB_001049e5;
            }
          }
          else {
            *local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start = 1.0;
          }
          cVar6 = std::__basic_file<char>::is_open();
          if (cVar6 == '\0') {
            local_790 = (string *)&std::cin;
          }
          local_7e8 = &local_550;
          std::ifstream::ifstream(local_7e8);
          if ((pcVar2 != (char *)0x0 & (byte)local_7e0) == 1) {
            std::ifstream::open((char *)&local_550,(_Ios_Openmode)pcVar2);
            if ((abStack_530[*(long *)(local_550._M_dataplus._M_p + -0x18)] & 5) != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_330,"Cannot open file ",0x11);
              sVar9 = strlen(pcVar2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,pcVar2,sVar9);
              local_100 = (undefined1  [8])(local_f8 + 8);
              std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"spec","");
              sptk::PrintErrorMessage((string *)local_100,(ostringstream *)local_330);
              if (local_100 != (undefined1  [8])(local_f8 + 8)) {
                operator_delete((void *)local_100);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
              std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
              iVar7 = 1;
              bVar5 = false;
              goto LAB_001049d8;
            }
          }
          else {
            *local_568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start = 1.0;
          }
          cVar6 = std::__basic_file<char>::is_open();
          if (cVar6 == '\0') {
            local_7e8 = (string *)&std::cin;
          }
          sptk::FilterCoefficientsToSpectrum::FilterCoefficientsToSpectrum
                    ((FilterCoefficientsToSpectrum *)local_100,local_7ec,local_7f0,local_7f4,
                     (InputOutputFormats)local_7a0,local_7c8,local_7d0);
          local_1b8._vptr_Buffer = (_func_int **)&PTR__Buffer_001147a8;
          local_1b8.fast_fourier_transform_buffer_._vptr_Buffer =
               (_func_int **)&PTR__Buffer_001147d8;
          memset(&local_1b8.fast_fourier_transform_buffer_.real_part_input_,0,0xa8);
          if (local_38 != false) {
            iVar7 = local_7f4 / 2 + 1;
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_348,(long)iVar7,(allocator_type *)local_330);
            goto LAB_0010441c;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_330,"Failed to set condition for transformation",0x2a);
          local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"spec","");
          sptk::PrintErrorMessage(&local_7c0,(ostringstream *)local_330);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
            operator_delete(local_7c0._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
          std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
          iVar7 = 1;
          bVar5 = false;
          goto LAB_001049a6;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_770);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_770,"Too many input files",0x14);
        local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"spec","");
        sptk::PrintErrorMessage(&local_550,(ostringstream *)&local_770);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_770);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_770,"Numerator and denominator coefficient files are required",
                   0x38);
        local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"spec","");
        sptk::PrintErrorMessage(&local_550,(ostringstream *)&local_770);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_550._M_dataplus._M_p != &local_550.field_2) {
        operator_delete(local_550._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_770);
      std::ios_base::~ios_base(local_700);
      iVar7 = 1;
      bVar5 = false;
      goto LAB_001049f2;
    }
    std::__cxx11::string::string((string *)psVar14,ya_optarg,(allocator *)&local_550);
    bVar4 = sptk::ConvertStringToDouble(psVar14,&local_7d0);
    bVar5 = 0.0 <= local_7d0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_770._M_dataplus._M_p != &local_770.field_2) {
      operator_delete(local_770._M_dataplus._M_p);
    }
    if (!bVar4 || bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_770);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_770,"The argument for the -E option must be a negative number",
                 0x38);
      local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"spec","");
      sptk::PrintErrorMessage(&local_550,(ostringstream *)&local_770);
LAB_00103f5f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_550._M_dataplus._M_p != &local_550.field_2) {
        operator_delete(local_550._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_770);
      std::ios_base::~ios_base(local_700);
      return 1;
    }
  }
  uVar10 = (undefined7)((ulong)ya_optarg >> 8);
  switch(iVar7) {
  case 0x65:
    std::__cxx11::string::string((string *)psVar14,ya_optarg,(allocator *)&local_550);
    bVar4 = sptk::ConvertStringToDouble(psVar14,&local_7c8);
    bVar5 = local_7c8 <= 0.0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_770._M_dataplus._M_p != &local_770.field_2) {
      operator_delete(local_770._M_dataplus._M_p);
    }
    if (!bVar4 || bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_770);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_770,"The argument for the -e option must be a positive number",
                 0x38);
      local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"spec","");
      sptk::PrintErrorMessage(&local_550,(ostringstream *)&local_770);
      goto LAB_00103f5f;
    }
    goto LAB_0010383e;
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
    goto switchD_00103868_caseD_66;
  case 0x68:
    anon_unknown.dwarf_2bd4::PrintUsage((ostream *)&std::cout);
    goto LAB_00103c9c;
  case 0x6c:
    std::__cxx11::string::string((string *)psVar14,ya_optarg,(allocator *)&local_550);
    bVar5 = sptk::ConvertStringToInteger(psVar14,&local_7f4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_770._M_dataplus._M_p != &local_770.field_2) {
      operator_delete(local_770._M_dataplus._M_p);
    }
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_770);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_770,"The argument for the -l option must be an integer",0x31);
      local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"spec","");
      sptk::PrintErrorMessage(&local_550,(ostringstream *)&local_770);
      goto LAB_00103f5f;
    }
    goto LAB_0010383e;
  case 0x6d:
    std::__cxx11::string::string((string *)psVar14,ya_optarg,(allocator *)&local_550);
    bVar5 = sptk::ConvertStringToInteger(psVar14,&local_7ec);
    bVar4 = local_7ec < 0;
    paVar8 = &local_770.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_770._M_dataplus._M_p != paVar8) {
      operator_delete(local_770._M_dataplus._M_p);
      paVar8 = extraout_RAX_00;
    }
    local_7d8 = CONCAT71((int7)((ulong)paVar8 >> 8),1);
    if (!bVar5 || bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_770);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_770,
                 "The argument for the -m option must be a non-negative integer",0x3d);
      local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"spec","");
      sptk::PrintErrorMessage(&local_550,(ostringstream *)&local_770);
      goto LAB_00103f5f;
    }
    goto LAB_0010383e;
  case 0x6e:
    std::__cxx11::string::string((string *)psVar14,ya_optarg,(allocator *)&local_550);
    bVar5 = sptk::ConvertStringToInteger(psVar14,&local_7f0);
    bVar4 = local_7f0 < 0;
    paVar8 = &local_770.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_770._M_dataplus._M_p != paVar8) {
      operator_delete(local_770._M_dataplus._M_p);
      paVar8 = extraout_RAX;
    }
    local_7e0 = CONCAT71((int7)((ulong)paVar8 >> 8),1);
    if (!bVar5 || bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_770);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_770,
                 "The argument for the -n option must be a non-negative integer",0x3d);
      local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"spec","");
      sptk::PrintErrorMessage(&local_550,(ostringstream *)&local_770);
      goto LAB_00103f5f;
    }
    goto LAB_0010383e;
  case 0x6f:
    std::__cxx11::string::string((string *)psVar14,ya_optarg,(allocator *)&local_550);
    bVar5 = sptk::ConvertStringToInteger(psVar14,(int *)local_330);
    if (bVar5) {
      bVar5 = sptk::IsInRange(local_330._0_4_,0,3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_770._M_dataplus._M_p != &local_770.field_2) {
        operator_delete(local_770._M_dataplus._M_p);
      }
      if (bVar5) {
        local_7a0 = local_330._0_8_ & 0xffffffff;
        goto LAB_0010383e;
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_770._M_dataplus._M_p != &local_770.field_2) {
      operator_delete(local_770._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_770);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_770,"The argument for the -o option must be an integer ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_770,"in the range of ",0x10);
    this = (ostream *)std::ostream::operator<<((ostream *)&local_770,0);
    std::__ostream_insert<char,std::char_traits<char>>(this," to ",4);
    std::ostream::operator<<((ostream *)this,3);
    local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"spec","");
    sptk::PrintErrorMessage(&local_550,(ostringstream *)&local_770);
    goto LAB_00103f5f;
  case 0x70:
    local_798 = ya_optarg;
    local_7e0 = CONCAT71(uVar10,1);
    goto LAB_0010383e;
  default:
    if (iVar7 == 0x7a) {
      local_7e8 = (string *)ya_optarg;
      local_7d8 = CONCAT71(uVar10,1);
      goto LAB_0010383e;
    }
switchD_00103868_caseD_66:
    anon_unknown.dwarf_2bd4::PrintUsage((ostream *)&std::cerr);
    return 1;
  }
  while (bVar4 = sptk::WriteStream<double>(0,iVar7,&local_788,(ostream *)&std::cout,(int *)0x0),
        bVar4) {
LAB_00104791:
    bVar5 = sptk::ReadStream<double>
                      (true,0,0,local_7f4,(vector<double,_std::allocator<double>_> *)&local_7c0,
                       (istream *)psVar14,(int *)0x0);
    if (!bVar5) {
      iVar7 = 0;
      goto LAB_00104ac4;
    }
    bVar4 = sptk::WaveformToSpectrum::Run
                      ((WaveformToSpectrum *)local_330,
                       (vector<double,_std::allocator<double>_> *)&local_7c0,&local_788,
                       (Buffer *)local_100);
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_550);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_550,"Failed to transform waveform to spectrum",0x28);
      local_1b8._vptr_Buffer =
           (_func_int **)&local_1b8.fast_fourier_transform_buffer_.real_part_input_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"spec","");
      sptk::PrintErrorMessage((string *)&local_1b8,(ostringstream *)&local_550);
      goto LAB_00104a8c;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_550);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_550,"Failed to write spectrum",0x18);
  local_1b8._vptr_Buffer = (_func_int **)&local_1b8.fast_fourier_transform_buffer_.real_part_input_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"spec","");
  sptk::PrintErrorMessage((string *)&local_1b8,(ostringstream *)&local_550);
LAB_00104a8c:
  if ((vector<double,_std::allocator<double>_> *)local_1b8._vptr_Buffer !=
      &local_1b8.fast_fourier_transform_buffer_.real_part_input_) {
    operator_delete(local_1b8._vptr_Buffer);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_550);
  std::ios_base::~ios_base(local_4e0);
  iVar7 = 1;
LAB_00104ac4:
  if (local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_7c0._M_dataplus._M_p);
  }
  bVar5 = !bVar5;
LAB_00104ae8:
  local_100 = (undefined1  [8])&PTR__Buffer_00114898;
  sptk::FilterCoefficientsToSpectrum::Buffer::~Buffer((Buffer *)local_f8);
  sptk::WaveformToSpectrum::~WaveformToSpectrum((WaveformToSpectrum *)local_330);
  std::ifstream::~ifstream(&local_770);
  goto LAB_00104a16;
  while( true ) {
    bVar5 = sptk::FilterCoefficientsToSpectrum::Run
                      ((FilterCoefficientsToSpectrum *)local_100,&local_788,&local_568,&local_348,
                       &local_1b8);
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,"Failed to transform filter coefficients to spectrum",0x33);
      local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"spec","");
      sptk::PrintErrorMessage(&local_7c0,(ostringstream *)local_330);
      goto LAB_0010495d;
    }
    bVar5 = sptk::WriteStream<double>(0,iVar7,&local_348,(ostream *)&std::cout,(int *)0x0);
    if (!bVar5) break;
LAB_0010441c:
    if ((((local_7d8 & 1) != 0) &&
        (bVar5 = sptk::ReadStream<double>
                           (false,0,0,(int)(lVar12 + 1U),&local_788,(istream *)local_790,(int *)0x0)
        , !bVar5)) ||
       (((local_7e0 & 1) != 0 &&
        (bVar5 = sptk::ReadStream<double>
                           (false,0,0,(int)(lVar13 + 1U),&local_568,(istream *)local_7e8,(int *)0x0)
        , !bVar5)))) {
      iVar7 = 0;
      bVar5 = true;
      goto LAB_00104994;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_330,"Failed to write spectrum",0x18);
  local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"spec","");
  sptk::PrintErrorMessage(&local_7c0,(ostringstream *)local_330);
LAB_0010495d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
    operator_delete(local_7c0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
  std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
  iVar7 = 1;
  bVar5 = false;
LAB_00104994:
  if (local_348.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_348.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_001049a6:
  sptk::FilterCoefficientsToSpectrum::Buffer::~Buffer(&local_1b8);
  local_100 = (undefined1  [8])&PTR__FilterCoefficientsToSpectrum_00114808;
  sptk::SpectrumToSpectrum::~SpectrumToSpectrum(&local_80);
  sptk::RealValuedFastFourierTransform::~RealValuedFastFourierTransform
            ((RealValuedFastFourierTransform *)(local_f8 + 0x10));
LAB_001049d8:
  std::ifstream::~ifstream(&local_550);
LAB_001049e5:
  std::ifstream::~ifstream(&local_770);
LAB_001049f2:
  if (local_568.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00104a16:
  if (bVar5) {
LAB_00103c9c:
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int main(int argc, char* argv[]) {
  int fft_length(kDefaultFftLength);
  int num_numerator_order(kDefaultNumNumeratorOrder);
  int num_denominator_order(kDefaultNumDenominatorOrder);
  const char* numerator_coefficients_file(NULL);
  const char* denominator_coefficients_file(NULL);
  bool is_numerator_specified(false);
  bool is_denominator_specified(false);
  double epsilon(0.0);
  double relative_floor_in_decibels(sptk::kMin);
  sptk::SpectrumToSpectrum::InputOutputFormats output_format(
      kDefaultOutputFormat);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "l:m:n:z:p:e:E:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_numerator_order) ||
            num_numerator_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        is_numerator_specified = true;
        break;
      }
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &num_denominator_order) ||
            num_denominator_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -n option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        is_denominator_specified = true;
        break;
      }
      case 'z': {
        numerator_coefficients_file = optarg;
        is_numerator_specified = true;
        break;
      }
      case 'p': {
        denominator_coefficients_file = optarg;
        is_denominator_specified = true;
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToDouble(optarg, &epsilon) || epsilon <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be a positive number";
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        break;
      }
      case 'E': {
        if (!sptk::ConvertStringToDouble(optarg, &relative_floor_in_decibels) ||
            0.0 <= relative_floor_in_decibels) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -E option must be a negative number";
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(
            static_cast<int>(sptk::SpectrumToSpectrum::kNumInputOutputFormats) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        output_format =
            static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("spec", error_message);
    return 1;
  }

  if (is_numerator_specified || is_denominator_specified) {
    const int numerator_length(num_numerator_order + 1);
    const int denominator_length(num_denominator_order + 1);
    std::vector<double> numerator_coefficients(numerator_length);
    std::vector<double> denominator_coefficients(denominator_length);

    if (is_numerator_specified && is_denominator_specified &&
        (NULL == numerator_coefficients_file ||
         NULL == denominator_coefficients_file)) {
      std::ostringstream error_message;
      error_message
          << "Numerator and denominator coefficient files are required";
      sptk::PrintErrorMessage("spec", error_message);
      return 1;
    }

    const int num_input_files(argc - optind);
    if (0 < num_input_files) {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("spec", error_message);
      return 1;
    }

    std::ifstream ifs_for_numerator;
    if (is_numerator_specified && NULL != numerator_coefficients_file) {
      ifs_for_numerator.open(numerator_coefficients_file,
                             std::ios::in | std::ios::binary);
      if (ifs_for_numerator.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << numerator_coefficients_file;
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }
    } else {
      numerator_coefficients[0] = 1.0;
    }
    std::istream& input_stream_for_numerator(
        ifs_for_numerator.is_open() ? ifs_for_numerator : std::cin);

    std::ifstream ifs_for_denominator;
    if (is_denominator_specified && NULL != denominator_coefficients_file) {
      ifs_for_denominator.open(denominator_coefficients_file,
                               std::ios::in | std::ios::binary);
      if (ifs_for_denominator.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << denominator_coefficients_file;
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }
    } else {
      denominator_coefficients[0] = 1.0;
    }
    std::istream& input_stream_for_denominator(
        ifs_for_denominator.is_open() ? ifs_for_denominator : std::cin);

    sptk::FilterCoefficientsToSpectrum filter_coefficients_to_spectrum(
        num_numerator_order, num_denominator_order, fft_length, output_format,
        epsilon, relative_floor_in_decibels);
    sptk::FilterCoefficientsToSpectrum::Buffer buffer;
    if (!filter_coefficients_to_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to set condition for transformation";
      sptk::PrintErrorMessage("spec", error_message);
      return 1;
    }

    const int output_length(fft_length / 2 + 1);
    std::vector<double> output(output_length);
    while ((!is_numerator_specified ||
            sptk::ReadStream(false, 0, 0, numerator_length,
                             &numerator_coefficients,
                             &input_stream_for_numerator, NULL)) &&
           (!is_denominator_specified ||
            sptk::ReadStream(false, 0, 0, denominator_length,
                             &denominator_coefficients,
                             &input_stream_for_denominator, NULL))) {
      if (!filter_coefficients_to_spectrum.Run(numerator_coefficients,
                                               denominator_coefficients,
                                               &output, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to transform filter coefficients to spectrum";
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }

      if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write spectrum";
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }
    }
  } else {
    const int num_input_files(argc - optind);
    if (1 < num_input_files) {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("spec", error_message);
      return 1;
    }
    const char* input_file(0 == num_input_files ? NULL : argv[optind]);

    std::ifstream ifs;
    if (NULL != input_file) {
      ifs.open(input_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << input_file;
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    sptk::WaveformToSpectrum waveform_to_spectrum(fft_length, fft_length,
                                                  output_format, epsilon,
                                                  relative_floor_in_decibels);
    sptk::WaveformToSpectrum::Buffer buffer;
    if (!waveform_to_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to set condition for transformation";
      sptk::PrintErrorMessage("spec", error_message);
      return 1;
    }

    const int output_length(fft_length / 2 + 1);
    std::vector<double> waveform(fft_length);
    std::vector<double> output(output_length);
    while (sptk::ReadStream(true, 0, 0, fft_length, &waveform, &input_stream,
                            NULL)) {
      if (!waveform_to_spectrum.Run(waveform, &output, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to spectrum";
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }

      if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write spectrum";
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }
    }
  }

  return 0;
}